

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

Expression * __thiscall
wasm::OptimizeInstructions::deduplicateBinary(OptimizeInstructions *this,Binary *outer)

{
  BinaryOp BVar1;
  Type type;
  bool bVar2;
  BinaryOp BVar3;
  Expression *pEVar4;
  byte bVar5;
  Expression *pEVar6;
  OptimizeInstructions *pOVar7;
  EffectAnalyzer local_1b0;
  OptimizeInstructions *local_40;
  byte local_31;
  
  type.id = (outer->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id;
  if ((type.id & 0xfffffffffffffffe) != 2) {
    return (Expression *)0x0;
  }
  pEVar4 = (Expression *)0x0;
  if (outer->right->_id == BinaryId) {
    pEVar4 = outer->right;
  }
  if ((pEVar4 == (Expression *)0x0) || (outer->op != pEVar4[1]._id)) {
LAB_00808ab9:
    bVar2 = true;
  }
  else {
    local_40 = this;
    EffectAnalyzer::EffectAnalyzer
              (&local_1b0,
               &((this->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).super_Pass.runner)->options,
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).
               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .
               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .currModule,outer->left);
    bVar5 = 1;
    if (((local_1b0.trap == false) &&
        (((((local_1b0.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count == 0 &&
            (local_1b0.danglingPop == false)) &&
           (local_1b0.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
          ((local_1b0.writesMemory == false && (local_1b0.writesTable == false)))) &&
         (local_1b0.writesStruct == false)))) &&
       ((((local_1b0.writesArray == false && (local_1b0.isAtomic == false)) &&
         (local_1b0.calls == false)) &&
        ((local_1b0.throws_ == false &&
         (local_1b0.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)))))) {
      bVar5 = local_1b0.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count != 0 |
              local_1b0.branchesOut;
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_1b0.delegateTargets._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_1b0.breakTargets._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_1b0.globalsWritten._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_1b0.mutableGlobalsRead._M_t);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_1b0.localsWritten._M_t);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_1b0.localsRead._M_t);
    if (local_1b0.funcEffectsMap.
        super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1b0.funcEffectsMap.
                 super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    this = local_40;
    if (bVar5 != 0) goto LAB_00808ab9;
    bVar2 = ExpressionAnalyzer::equal((Expression *)pEVar4[1].type.id,outer->left);
    if (bVar2) {
      if (6 < type.id) {
        __assert_fail("isBasic() && \"Basic type expected\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                      ,0xc6,"BasicType wasm::Type::getBasic() const");
      }
      BVar1 = outer->op;
      if ((BVar1 == *(BinaryOp *)(&DAT_00b8f0a4 + type.id * 4)) ||
         (BVar3 = Abstract::getBinary(type,Xor), BVar1 == BVar3)) {
        pEVar4 = *(Expression **)(pEVar4 + 2);
      }
      else {
        BVar1 = outer->op;
        BVar3 = Abstract::getBinary(type,And);
        if ((BVar1 != BVar3) &&
           (BVar1 = outer->op, BVar3 = Abstract::getBinary(type,Or), BVar1 != BVar3))
        goto LAB_00808a38;
      }
    }
    else {
LAB_00808a38:
      bVar2 = ExpressionAnalyzer::equal(*(Expression **)(pEVar4 + 2),outer->left);
      if ((!bVar2) ||
         (bVar2 = EffectAnalyzer::canReorder
                            (&((this->
                               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                               ).super_Pass.runner)->options,
                             (this->
                             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                             ).
                             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                             .
                             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                             .currModule,outer->left,(Expression *)pEVar4[1].type.id), !bVar2))
      goto LAB_00808ab9;
      BVar1 = outer->op;
      BVar3 = Abstract::getBinary(type,Xor);
      if (BVar1 == BVar3) {
        pEVar4 = (Expression *)pEVar4[1].type.id;
      }
      else {
        BVar1 = outer->op;
        BVar3 = Abstract::getBinary(type,And);
        if ((BVar1 != BVar3) &&
           (BVar1 = outer->op, BVar3 = Abstract::getBinary(type,Or), BVar1 != BVar3))
        goto LAB_00808ab9;
      }
    }
    bVar2 = false;
  }
  if (!bVar2) {
    return pEVar4;
  }
  pEVar6 = (Expression *)0x0;
  if (outer->left->_id == BinaryId) {
    pEVar6 = outer->left;
  }
  if ((pEVar6 != (Expression *)0x0) && (outer->op == pEVar6[1]._id)) {
    local_40 = this;
    EffectAnalyzer::EffectAnalyzer
              (&local_1b0,
               &((this->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).super_Pass.runner)->options,
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).
               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .
               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .currModule,outer->right);
    local_31 = 1;
    if ((((local_1b0.trap == false) &&
         (((local_1b0.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count == 0 &&
           (local_1b0.danglingPop == false)) &&
          (local_1b0.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)))) &&
        (((local_1b0.writesMemory == false && (local_1b0.writesTable == false)) &&
         (local_1b0.writesStruct == false)))) &&
       (((local_1b0.writesArray == false && (local_1b0.isAtomic == false)) &&
        ((local_1b0.calls == false &&
         ((local_1b0.throws_ == false &&
          (local_1b0.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)))))))) {
      local_31 = local_1b0.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count != 0 |
                 local_1b0.branchesOut;
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_1b0.delegateTargets._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_1b0.breakTargets._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_1b0.globalsWritten._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_1b0.mutableGlobalsRead._M_t);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_1b0.localsWritten._M_t);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_1b0.localsRead._M_t);
    if (local_1b0.funcEffectsMap.
        super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1b0.funcEffectsMap.
                 super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    pOVar7 = local_40;
    if (local_31 == 0) {
      bVar2 = ExpressionAnalyzer::equal(*(Expression **)(pEVar6 + 2),outer->right);
      if (bVar2) {
        BVar1 = outer->op;
        BVar3 = Abstract::getBinary(type,Xor);
        if (BVar1 != BVar3) {
          BVar1 = outer->op;
          BVar3 = Abstract::getBinary(type,RemS);
          if ((((BVar1 != BVar3) &&
               (BVar1 = outer->op, BVar3 = Abstract::getBinary(type,RemU), BVar1 != BVar3)) &&
              (BVar1 = outer->op, BVar3 = Abstract::getBinary(type,And), BVar1 != BVar3)) &&
             (BVar1 = outer->op, BVar3 = Abstract::getBinary(type,Or), pOVar7 = local_40,
             BVar1 != BVar3)) goto LAB_00808c91;
LAB_00808d10:
          bVar2 = false;
          pEVar4 = pEVar6;
          goto LAB_00808d19;
        }
        pEVar4 = (Expression *)pEVar6[1].type.id;
LAB_00808ce0:
        bVar2 = false;
        goto LAB_00808d19;
      }
LAB_00808c91:
      bVar2 = ExpressionAnalyzer::equal((Expression *)pEVar6[1].type.id,outer->right);
      if ((bVar2) &&
         (bVar2 = EffectAnalyzer::canReorder
                            (&((pOVar7->
                               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                               ).super_Pass.runner)->options,
                             (pOVar7->
                             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                             ).
                             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                             .
                             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                             .currModule,(Expression *)pEVar6[1].type.id,
                             *(Expression **)(pEVar6 + 2)), bVar2)) {
        BVar1 = outer->op;
        BVar3 = Abstract::getBinary(type,Xor);
        if (BVar1 == BVar3) {
          pEVar4 = *(Expression **)(pEVar6 + 2);
          goto LAB_00808ce0;
        }
        BVar1 = outer->op;
        BVar3 = Abstract::getBinary(type,And);
        if ((BVar1 == BVar3) ||
           (BVar1 = outer->op, BVar3 = Abstract::getBinary(type,Or), BVar1 == BVar3))
        goto LAB_00808d10;
      }
    }
  }
  bVar2 = true;
LAB_00808d19:
  if (bVar2) {
    return (Expression *)0x0;
  }
  return pEVar4;
}

Assistant:

Expression* deduplicateBinary(Binary* outer) {
    Type type = outer->type;
    if (type.isInteger()) {
      if (auto* inner = outer->right->dynCast<Binary>()) {
        if (outer->op == inner->op) {
          if (!EffectAnalyzer(getPassOptions(), *getModule(), outer->left)
                 .hasSideEffects()) {
            if (ExpressionAnalyzer::equal(inner->left, outer->left)) {
              // x - (x - y)  ==>   y
              // x ^ (x ^ y)  ==>   y
              if (outer->op == Abstract::getBinary(type, Abstract::Sub) ||
                  outer->op == Abstract::getBinary(type, Abstract::Xor)) {
                return inner->right;
              }
              // x & (x & y)  ==>   x & y
              // x | (x | y)  ==>   x | y
              if (outer->op == Abstract::getBinary(type, Abstract::And) ||
                  outer->op == Abstract::getBinary(type, Abstract::Or)) {
                return inner;
              }
            }
            if (ExpressionAnalyzer::equal(inner->right, outer->left) &&
                canReorder(outer->left, inner->left)) {
              // x ^ (y ^ x)  ==>   y
              // (note that we need the check for reordering here because if
              // e.g. y writes to a local that x reads, the second appearance
              // of x would be different from the first)
              if (outer->op == Abstract::getBinary(type, Abstract::Xor)) {
                return inner->left;
              }

              // x & (y & x)  ==>   y & x
              // x | (y | x)  ==>   y | x
              // (here we need the check for reordering for the more obvious
              // reason that previously x appeared before y, and now y appears
              // first; or, if we tried to emit x [&|] y here, reversing the
              // order, we'd be in the same situation as the previous comment)
              if (outer->op == Abstract::getBinary(type, Abstract::And) ||
                  outer->op == Abstract::getBinary(type, Abstract::Or)) {
                return inner;
              }
            }
          }
        }
      }
      if (auto* inner = outer->left->dynCast<Binary>()) {
        if (outer->op == inner->op) {
          if (!EffectAnalyzer(getPassOptions(), *getModule(), outer->right)
                 .hasSideEffects()) {
            if (ExpressionAnalyzer::equal(inner->right, outer->right)) {
              // (x ^ y) ^ y  ==>   x
              if (outer->op == Abstract::getBinary(type, Abstract::Xor)) {
                return inner->left;
              }
              // (x % y) % y  ==>   x % y
              // (x & y) & y  ==>   x & y
              // (x | y) | y  ==>   x | y
              if (outer->op == Abstract::getBinary(type, Abstract::RemS) ||
                  outer->op == Abstract::getBinary(type, Abstract::RemU) ||
                  outer->op == Abstract::getBinary(type, Abstract::And) ||
                  outer->op == Abstract::getBinary(type, Abstract::Or)) {
                return inner;
              }
            }
            // See comments in the parallel code earlier about ordering here.
            if (ExpressionAnalyzer::equal(inner->left, outer->right) &&
                canReorder(inner->left, inner->right)) {
              // (x ^ y) ^ x  ==>   y
              if (outer->op == Abstract::getBinary(type, Abstract::Xor)) {
                return inner->right;
              }
              // (x & y) & x  ==>   x & y
              // (x | y) | x  ==>   x | y
              if (outer->op == Abstract::getBinary(type, Abstract::And) ||
                  outer->op == Abstract::getBinary(type, Abstract::Or)) {
                return inner;
              }
            }
          }
        }
      }
    }
    return nullptr;
  }